

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_length_byte_array_decoder.cpp
# Opt level: O3

void __thiscall
duckdb::DeltaLengthByteArrayDecoder::SkipInternal<false>
          (DeltaLengthByteArrayDecoder *this,uint8_t *defines,idx_t skip_count)

{
  uint64_t *puVar1;
  ulong uVar2;
  type this_00;
  IOException *this_01;
  idx_t iVar3;
  uint64_t req_len;
  string local_48;
  
  this_00 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(&this->reader->block);
  uVar2 = this->length_idx + skip_count;
  if (uVar2 <= this->byte_array_count) {
    if (skip_count == 0) {
      req_len = 0;
    }
    else {
      iVar3 = 0;
      req_len = 0;
      do {
        req_len = req_len + *(uint *)((this->length_buffer->super_ByteBuffer).ptr +
                                     iVar3 * 4 + this->length_idx * 4);
        iVar3 = iVar3 + 1;
      } while (skip_count != iVar3);
      this->length_idx = uVar2;
    }
    ByteBuffer::available(&this_00->super_ByteBuffer,req_len);
    puVar1 = &(this_00->super_ByteBuffer).len;
    *puVar1 = *puVar1 - req_len;
    (this_00->super_ByteBuffer).ptr = (this_00->super_ByteBuffer).ptr + req_len;
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted read of %d from %d entries) - corrupt file?"
             ,"");
  IOException::IOException<unsigned_long,unsigned_long>
            (this_01,&local_48,skip_count + this->length_idx,this->byte_array_count);
  __cxa_throw(this_01,&IOException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DeltaLengthByteArrayDecoder::SkipInternal(uint8_t *defines, idx_t skip_count) {
	auto &block = *reader.block;
	const auto length_data = reinterpret_cast<uint32_t *>(length_buffer.ptr);

	if (!HAS_DEFINES) {
		// Fast path: take this out of the loop below
		if (length_idx + skip_count > byte_array_count) {
			throw IOException(
			    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
			    "read of %d from %d entries) - corrupt file?",
			    length_idx + skip_count, byte_array_count);
		}
	}

	idx_t skip_bytes = 0;
	for (idx_t row_idx = 0; row_idx < skip_count; row_idx++) {
		if (HAS_DEFINES) {
			if (defines[row_idx] != reader.MaxDefine()) {
				continue;
			}
			if (length_idx >= byte_array_count) {
				throw IOException(
				    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
				    "read of %d from %d entries) - corrupt file?",
				    length_idx, byte_array_count);
			}
		}
		skip_bytes += length_data[length_idx++];
	}
	block.inc(skip_bytes);
}